

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Bac_ManWriteVerilogNtk(Bac_Ntk_t *p,int fUseAssign)

{
  Vec_Str_t *p_00;
  int iVar1;
  int iVar2;
  int End_00;
  int iVar3;
  Bac_NameType_t BVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  int local_64;
  int StartPos;
  int fHaveWires;
  int Length;
  int End;
  int Beg;
  int Value;
  int iTerm;
  int iObj;
  int k;
  Vec_Str_t *vStr;
  char *pKeyword [4];
  int fUseAssign_local;
  Bac_Ntk_t *p_local;
  
  pKeyword[0] = "input ";
  pKeyword[1] = "output ";
  pKeyword[2] = "inout ";
  p_00 = p->pDesign->vOut;
  pKeyword[3]._4_4_ = fUseAssign;
  iVar1 = Vec_IntSize(&p->vFanin);
  iVar2 = Bac_NtkObjNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x24b,"void Bac_ManWriteVerilogNtk(Bac_Ntk_t *, int)");
  }
  Vec_StrPrintStr(p_00,"module ");
  pcVar5 = Bac_NtkName(p);
  Vec_StrPrintStr(p_00,pcVar5);
  Vec_StrPrintStr(p_00," (\n    ");
  local_64 = Vec_StrSize(p_00);
  for (iTerm = 0; iVar1 = Vec_IntSize(&p->vInfo), iTerm + 2 < iVar1; iTerm = iTerm + 3) {
    iVar1 = Vec_IntEntry(&p->vInfo,iTerm);
    Vec_IntEntry(&p->vInfo,iTerm + 1);
    Vec_IntEntry(&p->vInfo,iTerm + 2);
    iVar2 = Abc_Lit2Att2(iVar1);
    if (iVar2 != 0) {
      pcVar5 = "";
      if (iTerm != 0) {
        pcVar5 = ", ";
      }
      Vec_StrPrintStr(p_00,pcVar5);
      iVar2 = Vec_StrSize(p_00);
      if (local_64 + 0x46 < iVar2) {
        local_64 = Vec_StrSize(p_00);
        Vec_StrPrintStr(p_00,"\n    ");
      }
      iVar1 = Abc_Lit2Var2(iVar1);
      Bac_ManWriteVar(p,iVar1);
    }
  }
  Vec_StrPrintStr(p_00,"\n  );\n");
  for (iTerm = 0; iVar1 = Vec_IntSize(&p->vInfo), iTerm + 2 < iVar1; iTerm = iTerm + 3) {
    iVar1 = Vec_IntEntry(&p->vInfo,iTerm);
    iVar2 = Vec_IntEntry(&p->vInfo,iTerm + 1);
    End_00 = Vec_IntEntry(&p->vInfo,iTerm + 2);
    iVar3 = Abc_Lit2Att2(iVar1);
    if (iVar3 != 0) {
      Vec_StrPrintStr(p_00,"  ");
      iVar3 = Abc_Lit2Att2(iVar1);
      Vec_StrPrintStr(p_00,pKeyword[(long)iVar3 + -1]);
      if (-1 < iVar2) {
        Bac_ManWriteRange(p,iVar2,End_00);
      }
      iVar1 = Abc_Lit2Var2(iVar1);
      Bac_ManWriteVar(p,iVar1);
      Vec_StrPrintStr(p_00,";\n");
    }
  }
  Vec_StrPrintStr(p_00,"\n");
  for (Value = 0; iVar1 = Bac_NtkObjNum(p), Value < iVar1; Value = Value + 1) {
    iVar1 = Bac_ObjIsBox(p,Value);
    if ((iVar1 != 0) && (iVar1 = Bac_ObjIsConst(p,Value), Beg = Value, iVar1 == 0)) {
      while( true ) {
        Beg = Beg + 1;
        iVar1 = Bac_NtkObjNum(p);
        bVar7 = false;
        if (Beg < iVar1) {
          iVar1 = Bac_ObjIsBo(p,Beg);
          bVar7 = iVar1 != 0;
        }
        if (!bVar7) break;
        BVar4 = Bac_ObjNameType(p,Beg);
        if ((BVar4 == BAC_NAME_WORD) || (BVar4 = Bac_ObjNameType(p,Beg), BVar4 == BAC_NAME_INFO)) {
          Vec_StrPrintStr(p_00,"  wire ");
          iVar1 = Bac_ManFindRealIndex(p,Beg);
          iVar2 = Bac_ObjGetRange(p,Beg);
          iVar2 = Bac_ManFindRealIndex(p,Beg + iVar2 + -1);
          Bac_ManWriteRange(p,iVar1,iVar2);
          iVar1 = Bac_ManFindRealNameId(p,Beg);
          Bac_ManWriteVar(p,iVar1);
          Vec_StrPrintStr(p_00,";\n");
        }
      }
    }
  }
  bVar7 = false;
  Value = 0;
  do {
    iVar1 = Bac_NtkObjNum(p);
    if (iVar1 <= Value) {
      if (bVar7) {
        StartPos = 7;
        Vec_StrPrintStr(p_00,"\n  wire ");
        for (Value = 0; iVar1 = Bac_NtkObjNum(p), Value < iVar1; Value = Value + 1) {
          iVar1 = Bac_ObjIsBox(p,Value);
          if ((iVar1 != 0) && (iVar1 = Bac_ObjIsConst(p,Value), Beg = Value, iVar1 == 0)) {
            while( true ) {
              Beg = Beg + 1;
              iVar1 = Bac_NtkObjNum(p);
              bVar7 = false;
              if (Beg < iVar1) {
                iVar1 = Bac_ObjIsBo(p,Beg);
                bVar7 = iVar1 != 0;
              }
              if (!bVar7) break;
              BVar4 = Bac_ObjNameType(p,Beg);
              if (BVar4 == BAC_NAME_BIN) {
                if (0x48 < StartPos) {
                  Vec_StrPrintStr(p_00,";\n  wire ");
                  StartPos = 7;
                }
                if (7 < StartPos) {
                  Vec_StrPrintStr(p_00,", ");
                }
                pcVar5 = Bac_ObjNameStr(p,Beg);
                Vec_StrPrintStr(p_00,pcVar5);
                pcVar5 = Bac_ObjNameStr(p,Beg);
                sVar6 = strlen(pcVar5);
                StartPos = StartPos + (int)sVar6;
              }
            }
          }
        }
        Vec_StrPrintStr(p_00,";\n");
      }
      Vec_StrPrintStr(p_00,"\n");
      Bac_ManWriteVerilogBoxes(p,pKeyword[3]._4_4_);
      Vec_StrPrintStr(p_00,"endmodule\n\n");
      return;
    }
    iVar1 = Bac_ObjIsBox(p,Value);
    if ((iVar1 != 0) && (iVar1 = Bac_ObjIsConst(p,Value), Beg = Value, iVar1 == 0)) {
      do {
        Beg = Beg + 1;
        iVar1 = Bac_NtkObjNum(p);
        bVar8 = false;
        if (Beg < iVar1) {
          iVar1 = Bac_ObjIsBo(p,Beg);
          bVar8 = iVar1 != 0;
        }
        if (!bVar8) goto LAB_0043e8d1;
        BVar4 = Bac_ObjNameType(p,Beg);
      } while (BVar4 != BAC_NAME_BIN);
      bVar7 = true;
      Value = Bac_NtkObjNum(p);
    }
LAB_0043e8d1:
    Value = Value + 1;
  } while( true );
}

Assistant:

void Bac_ManWriteVerilogNtk( Bac_Ntk_t * p, int fUseAssign )
{
    char * pKeyword[4] = { "wire ", "input ", "output ", "inout " };
    Vec_Str_t * vStr = p->pDesign->vOut;
    int k, iObj, iTerm, Value, Beg, End, Length, fHaveWires, StartPos;
//    assert( Bac_NtkInfoNum(p) );
    assert( Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p) );
//    Bac_NtkPrint( p );
    // write header
    Vec_StrPrintStr( vStr, "module " );
    Vec_StrPrintStr( vStr, Bac_NtkName(p) );
    Vec_StrPrintStr( vStr, " (\n    " );
    StartPos = Vec_StrSize(vStr);
    Vec_IntForEachEntryTriple( &p->vInfo, Value, Beg, End, k )
    if ( Abc_Lit2Att2(Value) != 0 )
    {
        Vec_StrPrintStr( vStr, k ? ", " : "" );
        if ( Vec_StrSize(vStr) > StartPos + 70 )
        {
            StartPos = Vec_StrSize(vStr);
            Vec_StrPrintStr( vStr, "\n    " );
        }
        Bac_ManWriteVar( p, Abc_Lit2Var2(Value) );
    }
    Vec_StrPrintStr( vStr, "\n  );\n" );
    // write inputs/outputs
    Vec_IntForEachEntryTriple( &p->vInfo, Value, Beg, End, k )
    if ( Abc_Lit2Att2(Value) != 0 )
    {
        Vec_StrPrintStr( vStr, "  " );
        Vec_StrPrintStr( vStr, pKeyword[Abc_Lit2Att2(Value)] );
        if ( Beg >= 0 )
            Bac_ManWriteRange( p, Beg, End );
        Bac_ManWriteVar( p, Abc_Lit2Var2(Value) );
        Vec_StrPrintStr( vStr, ";\n" );
    }
    Vec_StrPrintStr( vStr, "\n" );
    // write word-level wires
    Bac_NtkForEachBox( p, iObj )
    if ( !Bac_ObjIsConst(p, iObj) )
        Bac_BoxForEachBo( p, iObj, iTerm, k )
        if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_WORD || Bac_ObjNameType(p, iTerm) == BAC_NAME_INFO )
        {
            Vec_StrPrintStr( vStr, "  wire " );
            Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, iTerm), Bac_ManFindRealIndex(p, iTerm + Bac_ObjGetRange(p, iTerm) - 1) );
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, iTerm) );
            Vec_StrPrintStr( vStr, ";\n" );
        }
    // check if there are any wires left
    fHaveWires = 0;
    Bac_NtkForEachBox( p, iObj )
    if ( !Bac_ObjIsConst(p, iObj) )
        Bac_BoxForEachBo( p, iObj, iTerm, k )
        if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_BIN )
        { fHaveWires = 1; iObj = Bac_NtkObjNum(p); break; }
    // write bit-level wires
    if ( fHaveWires )
    {
        Length = 7;
        Vec_StrPrintStr( vStr, "\n  wire " );
        Bac_NtkForEachBox( p, iObj )
        if ( !Bac_ObjIsConst(p, iObj) )
            Bac_BoxForEachBo( p, iObj, iTerm, k )
            if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_BIN )
            {
                if ( Length > 72 )
                    Vec_StrPrintStr( vStr, ";\n  wire " ), Length = 7;
                if ( Length > 7 )
                    Vec_StrPrintStr( vStr, ", " );
                Vec_StrPrintStr( vStr, Bac_ObjNameStr(p, iTerm) ); 
                Length += strlen(Bac_ObjNameStr(p, iTerm));
            }
        Vec_StrPrintStr( vStr, ";\n" );
    }
    Vec_StrPrintStr( vStr, "\n" );
    // write objects
    Bac_ManWriteVerilogBoxes( p, fUseAssign );
    Vec_StrPrintStr( vStr, "endmodule\n\n" );
}